

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdToGiaCompose_rec(Gia_Man_t *pGia,word Func,int *pFanins,int nVars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  
  if (Func == 0xffffffffffffffff) {
    uVar3 = 1;
  }
  else if (Func == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = (ulong)(uint)nVars + 1;
    iVar1 = nVars + -1;
    while( true ) {
      iVar2 = iVar1;
      if (iVar2 + 1 < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x3d,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
      }
      if (iVar2 == 0) break;
      bVar5 = (byte)(1 << ((byte)iVar2 & 0x1f));
      uVar6 = uVar4 - 2 & 0xffffffff;
      uVar4 = uVar4 - 1;
      iVar1 = iVar2 + -1;
      if ((s_Truths6Neg[uVar6] & (Func >> (bVar5 & 0x3f) ^ Func)) != 0) {
        if (6 < uVar4) {
          __assert_fail("iVar >= 0 && iVar < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
        }
        uVar4 = s_Truths6Neg[uVar6] & Func;
        iVar1 = Dau_DsdToGiaCompose_rec(pGia,uVar4 << (bVar5 & 0x3f) | uVar4,pFanins,iVar2);
        iVar2 = Dau_DsdToGiaCompose_rec
                          (pGia,(Func & s_Truths6[uVar6]) >> (bVar5 & 0x3f) |
                                Func & s_Truths6[uVar6],pFanins,iVar2);
        if (pGia->pMuxes != (uint *)0x0) {
          iVar1 = Gia_ManHashMuxReal(pGia,pFanins[uVar6],iVar2,iVar1);
          return iVar1;
        }
        iVar1 = Gia_ManHashMux(pGia,pFanins[uVar6],iVar2,iVar1);
        return iVar1;
      }
    }
    if ((Func != 0xaaaaaaaaaaaaaaaa) && (Func != 0x5555555555555555)) {
      __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x40,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
    }
    if (*pFanins < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10f,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = *pFanins ^ (uint)(Func == 0x5555555555555555);
  }
  return uVar3;
}

Assistant:

int Dau_DsdToGiaCompose_rec( Gia_Man_t * pGia, word Func, int * pFanins, int nVars )
{
    int t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return 1;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return Abc_LitNotCond( pFanins[0], (int)(Func == s_Truths6Neg[0]) );
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_DsdToGiaCompose_rec( pGia, Func, pFanins, nVars );
    t0 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    if ( pGia->pMuxes )
        return Gia_ManHashMuxReal( pGia, pFanins[nVars], t1, t0 );
    else
        return Gia_ManHashMux( pGia, pFanins[nVars], t1, t0 );
}